

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O1

string * __thiscall
absl::lts_20240722::FormatTime_abi_cxx11_
          (string *__return_storage_ptr__,lts_20240722 *this,string_view format,Time t,TimeZone tz)

{
  char *pcVar1;
  char *pcVar2;
  undefined4 in_register_0000008c;
  cctz_parts parts;
  long *local_60 [2];
  long local_50 [2];
  undefined8 local_40;
  char *local_38;
  long local_30;
  
  local_38 = format._M_str;
  if (t.rep_.rep_hi_.lo_ == 0xffffffff && local_38 == (char *)0x7fffffffffffffff) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "infinite-future";
    pcVar1 = "";
  }
  else {
    if (local_38 != (char *)0x8000000000000000 || t.rep_.rep_hi_.lo_ != 0xffffffff) {
      local_30 = ((ulong)t.rep_.rep_hi_ & 0xffffffff) * 250000;
      local_60[0] = local_50;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_60,format._M_len,this + format._M_len);
      local_40 = CONCAT44(in_register_0000008c,t.rep_.rep_lo_);
      absl::lts_20240722::time_internal::cctz::detail::format
                ((string *)__return_storage_ptr__,(time_point *)local_60,(duration *)&local_38,
                 (time_zone *)&local_30);
      if (local_60[0] == local_50) {
        return __return_storage_ptr__;
      }
      operator_delete(local_60[0],local_50[0] + 1);
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "infinite-past";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatTime(absl::string_view format, absl::Time t,
                       absl::TimeZone tz) {
  if (t == absl::InfiniteFuture()) return std::string(kInfiniteFutureStr);
  if (t == absl::InfinitePast()) return std::string(kInfinitePastStr);
  const auto parts = Split(t);
  return cctz::detail::format(std::string(format), parts.sec, parts.fem,
                              cctz::time_zone(tz));
}